

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O2

void __thiscall
UtestShell::assertTrue
          (UtestShell *this,bool condition,char *checkString,char *conditionString,char *text,
          char *fileName,int lineNumber,TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  undefined7 in_register_00000031;
  SimpleString local_88;
  SimpleString local_80;
  SimpleString local_78;
  TestFailure local_70;
  
  pTVar1 = getTestResult(this);
  (*pTVar1->_vptr_TestResult[10])(pTVar1);
  if ((int)CONCAT71(in_register_00000031,condition) == 0) {
    SimpleString::SimpleString(&local_80,checkString);
    SimpleString::SimpleString(&local_88,conditionString);
    SimpleString::SimpleString(&local_78,text);
    CheckFailure::CheckFailure
              ((CheckFailure *)&local_70,this,fileName,lineNumber,&local_80,&local_88,&local_78);
    (*this->_vptr_UtestShell[0x25])(this,&local_70,testTerminator);
    TestFailure::~TestFailure(&local_70);
    SimpleString::~SimpleString(&local_78);
    SimpleString::~SimpleString(&local_88);
    SimpleString::~SimpleString(&local_80);
  }
  return;
}

Assistant:

void UtestShell::assertTrue(bool condition, const char *checkString, const char *conditionString, const char* text, const char *fileName, int lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (!condition)
        failWith(CheckFailure(this, fileName, lineNumber, checkString, conditionString, text), testTerminator);
}